

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O2

int nghttp2_submit_origin
              (nghttp2_session *session,uint8_t flags,nghttp2_origin_entry *ov,size_t nov)

{
  nghttp2_mem *mem;
  size_t len;
  int iVar1;
  long lVar2;
  nghttp2_origin_entry *ov_00;
  uint8_t *puVar3;
  nghttp2_origin_entry *dest;
  nghttp2_outbound_item *item;
  size_t *psVar4;
  size_t sVar5;
  size_t sVar6;
  bool bVar7;
  
  if (session->server == '\0') {
    return -0x207;
  }
  mem = &session->mem;
  if (nov == 0) {
    ov_00 = (nghttp2_origin_entry *)0x0;
  }
  else {
    psVar4 = &ov->origin_len;
    lVar2 = 0;
    sVar5 = nov;
    while (bVar7 = sVar5 != 0, sVar5 = sVar5 - 1, bVar7) {
      lVar2 = lVar2 + *psVar4;
      psVar4 = psVar4 + 2;
    }
    if (0x4000 < lVar2 + nov * 2) {
      return -0x1f5;
    }
    sVar5 = nov * 0x11 + lVar2;
    ov_00 = (nghttp2_origin_entry *)nghttp2_mem_malloc(mem,sVar5);
    if (ov_00 == (nghttp2_origin_entry *)0x0) {
      return -0x385;
    }
    dest = ov_00 + nov;
    lVar2 = 8;
    sVar6 = nov;
    while (bVar7 = sVar6 != 0, sVar6 = sVar6 - 1, bVar7) {
      *(nghttp2_origin_entry **)((long)ov_00 + lVar2 + -8) = dest;
      len = *(size_t *)((long)&ov->origin + lVar2);
      *(size_t *)((long)&ov_00->origin + lVar2) = len;
      puVar3 = nghttp2_cpymem((uint8_t *)dest,*(void **)((long)ov + lVar2 + -8),len);
      *puVar3 = '\0';
      dest = (nghttp2_origin_entry *)(puVar3 + 1);
      lVar2 = lVar2 + 0x10;
    }
    if ((long)dest - (long)ov_00 != sVar5) {
      __assert_fail("(size_t)(p - (uint8_t *)ov_copy) == nov * sizeof(nghttp2_origin_entry) + len + nov"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_submit.c"
                    ,0x278,
                    "int nghttp2_submit_origin(nghttp2_session *, uint8_t, const nghttp2_origin_entry *, size_t)"
                   );
    }
  }
  item = (nghttp2_outbound_item *)nghttp2_mem_malloc(mem,0x98);
  if (item == (nghttp2_outbound_item *)0x0) {
    free(ov_00);
    return -0x385;
  }
  nghttp2_outbound_item_init(item);
  (item->aux_data).goaway.flags = '\x01';
  (item->frame).ext.payload = &item->ext_frame_payload;
  nghttp2_frame_origin_init((nghttp2_extension *)item,ov_00,nov);
  iVar1 = nghttp2_session_add_item(session,item);
  if (iVar1 == 0) {
    return 0;
  }
  nghttp2_frame_origin_free((nghttp2_extension *)item,mem);
  nghttp2_mem_free(mem,item);
  return iVar1;
}

Assistant:

int nghttp2_submit_origin(nghttp2_session *session, uint8_t flags,
                          const nghttp2_origin_entry *ov, size_t nov) {
  nghttp2_mem *mem;
  uint8_t *p;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_ext_origin *origin;
  nghttp2_origin_entry *ov_copy;
  size_t len = 0;
  size_t i;
  int rv;
  (void)flags;

  mem = &session->mem;

  if (!session->server) {
    return NGHTTP2_ERR_INVALID_STATE;
  }

  if (nov) {
    for (i = 0; i < nov; ++i) {
      len += ov[i].origin_len;
    }

    if (2 * nov + len > NGHTTP2_MAX_PAYLOADLEN) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    /* The last nov is added for terminal NULL character. */
    ov_copy =
        nghttp2_mem_malloc(mem, nov * sizeof(nghttp2_origin_entry) + len + nov);
    if (ov_copy == NULL) {
      return NGHTTP2_ERR_NOMEM;
    }

    p = (uint8_t *)ov_copy + nov * sizeof(nghttp2_origin_entry);

    for (i = 0; i < nov; ++i) {
      ov_copy[i].origin = p;
      ov_copy[i].origin_len = ov[i].origin_len;
      p = nghttp2_cpymem(p, ov[i].origin, ov[i].origin_len);
      *p++ = '\0';
    }

    assert((size_t)(p - (uint8_t *)ov_copy) ==
           nov * sizeof(nghttp2_origin_entry) + len + nov);
  } else {
    ov_copy = NULL;
  }

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    rv = NGHTTP2_ERR_NOMEM;
    goto fail_item_malloc;
  }

  nghttp2_outbound_item_init(item);

  item->aux_data.ext.builtin = 1;

  origin = &item->ext_frame_payload.origin;

  frame = &item->frame;
  frame->ext.payload = origin;

  nghttp2_frame_origin_init(&frame->ext, ov_copy, nov);

  rv = nghttp2_session_add_item(session, item);
  if (rv != 0) {
    nghttp2_frame_origin_free(&frame->ext, mem);
    nghttp2_mem_free(mem, item);

    return rv;
  }

  return 0;

fail_item_malloc:
  free(ov_copy);

  return rv;
}